

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::CompressAlphaBlock(sU8 *dest,sU32 *src)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long in_RSI;
  undefined1 *in_RDI;
  sInt t;
  sInt ind;
  sInt a;
  sInt i_1;
  sInt mask;
  sInt bits;
  sInt dist2;
  sInt dist4;
  sInt bias;
  sInt dist;
  sInt i;
  sInt max;
  sInt min;
  Pixel *block;
  int local_40;
  uint local_3c;
  int local_38;
  int local_24;
  uint local_20;
  uint local_1c;
  undefined1 *local_8;
  
  local_20 = (uint)*(byte *)(in_RSI + 3);
  local_1c = local_20;
  for (local_24 = 1; local_24 < 0x10; local_24 = local_24 + 1) {
    local_1c = sMin<int>(local_1c,(uint)*(byte *)(in_RSI + 3 + (long)local_24 * 4));
    local_20 = sMax<int>(local_20,(uint)*(byte *)(in_RSI + 3 + (long)local_24 * 4));
  }
  *in_RDI = (char)local_20;
  local_8 = in_RDI + 2;
  in_RDI[1] = (char)local_1c;
  iVar1 = local_20 - local_1c;
  local_38 = 0;
  local_3c = 0;
  for (local_40 = 0; local_40 < 0x10; local_40 = local_40 + 1) {
    iVar2 = (uint)*(byte *)(in_RSI + 3 + (long)local_40 * 4) * 7 - (local_1c * 7 - (iVar1 >> 1));
    uVar3 = iVar1 * 4 - iVar2 >> 0x1f;
    iVar2 = iVar2 - (iVar1 * 4 & uVar3);
    uVar4 = iVar1 * 2 - iVar2 >> 0x1f;
    uVar3 = -(((int)(iVar1 - (iVar2 - (iVar1 * 2 & uVar4))) >> 0x1f & 1U) +
             (uVar4 & 2) + (uVar3 & 4)) & 7;
    local_3c = (uVar3 < 2 ^ uVar3) << ((byte)local_38 & 0x1f) | local_3c;
    iVar2 = local_38 + 3;
    if (7 < local_38 + 3) {
      *local_8 = (char)local_3c;
      local_3c = (int)local_3c >> 8;
      iVar2 = local_38 + -5;
      local_8 = local_8 + 1;
    }
    local_38 = iVar2;
  }
  return;
}

Assistant:

static void CompressAlphaBlock(sU8* dest, const sU32* src) {
  const Pixel* block = (const Pixel*)src;

  // find min/max color
  sInt min, max;
  min = max = block[0].a;

  for (sInt i = 1; i < 16; i++) {
    min = sMin<sInt>(min, block[i].a);
    max = sMax<sInt>(max, block[i].a);
  }

  // encode them
  *dest++ = max;
  *dest++ = min;

  // determine bias and emit color indices
  sInt dist = max - min;
  sInt bias = min * 7 - (dist >> 1);
  sInt dist4 = dist * 4;
  sInt dist2 = dist * 2;
  sInt bits = 0, mask = 0;

  for (sInt i = 0; i < 16; i++) {
    sInt a = block[i].a * 7 - bias;
    sInt ind, t;

    // select index (hooray for bit magic)
    t = (dist4 - a) >> 31;
    ind = t & 4;
    a -= dist4 & t;
    t = (dist2 - a) >> 31;
    ind += t & 2;
    a -= dist2 & t;
    t = (dist - a) >> 31;
    ind += t & 1;

    ind = -ind & 7;
    ind ^= (2 > ind);

    // write index
    mask |= ind << bits;
    if ((bits += 3) >= 8) {
      *dest++ = mask;
      mask >>= 8;
      bits -= 8;
    }
  }
}